

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O0

vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *
polyscope::
adaptorF_convertArrayOfVectorToStdVectorImpl<std::array<unsigned_long,2ul>,2u,std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>,void>
          (allocator_type *param_1,
          vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *param_2)

{
  size_t __n;
  const_reference pvVar1;
  reference pvVar2;
  size_t j;
  size_t i;
  size_t dataSize;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *dataOut;
  size_type in_stack_ffffffffffffff88;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *in_stack_ffffffffffffff90;
  allocator_type *__a;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *this;
  ulong local_48;
  ulong local_40;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> local_22;
  allocator_type *local_8;
  
  __a = param_1;
  local_22.
  super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._10_8_ = param_2;
  local_8 = param_1;
  __n = adaptorF_size<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                  (in_stack_ffffffffffffff90);
  local_22.
  super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  this = &local_22;
  local_22.
  super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = __n;
  std::allocator<std::array<unsigned_long,_2UL>_>::allocator
            ((allocator<std::array<unsigned_long,_2UL>_> *)0x4a7148);
  std::vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>::
  vector(this,__n,__a);
  std::allocator<std::array<unsigned_long,_2UL>_>::~allocator
            ((allocator<std::array<unsigned_long,_2UL>_> *)0x4a7168);
  for (local_40 = 0;
      local_40 <
      (ulong)local_22.
             super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
             ._M_impl.super__Vector_impl_data._2_8_; local_40 = local_40 + 1) {
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::operator[]
                ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                 local_22.
                 super__Vector_base<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._10_8_,local_40);
      pvVar1 = std::array<int,_2UL>::operator[]
                         ((array<int,_2UL> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff90 =
           (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)(long)*pvVar1;
      std::vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
      ::operator[]((vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                    *)__a,local_40);
      pvVar2 = std::array<unsigned_long,_2UL>::operator[]
                         ((array<unsigned_long,_2UL> *)in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
      *pvVar2 = (value_type_conflict1)in_stack_ffffffffffffff90;
    }
  }
  return (vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *
         )param_1;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<7>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}